

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_compress.hpp
# Opt level: O2

void __thiscall
duckdb::AlpCompressionState<double>::AlpCompressionState
          (AlpCompressionState<double> *this,ColumnDataCheckpointData *checkpoint_data,
          AlpAnalyzeState<double> *analyze_state)

{
  CompressionFunction *pCVar1;
  RowGroup *pRVar2;
  
  (this->super_CompressionState).info.block_manager =
       (analyze_state->super_AnalyzeState).info.block_manager;
  (this->super_CompressionState)._vptr_CompressionState =
       (_func_int **)&PTR__AlpCompressionState_027bf0d0;
  this->checkpoint_data = checkpoint_data;
  pCVar1 = ColumnDataCheckpointData::GetCompressionFunction(checkpoint_data,COMPRESSION_ALP);
  this->function = pCVar1;
  (this->current_segment).
  super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl = (ColumnSegment *)0x0;
  BufferHandle::BufferHandle(&this->handle);
  this->vectors_flushed = 0;
  this->data_bytes_used = 0;
  this->vector_idx = 0;
  this->nulls_idx = 0;
  this->next_vector_byte_index_start = 4;
  (this->state).best_k_combinations.
  super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
  super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->state).best_k_combinations.
  super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
  super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->state).best_k_combinations.
  super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
  super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->state).vector_encoding_indices.exponent = '\0';
  (this->state).vector_encoding_indices.factor = '\0';
  (this->state).exceptions_count = 0;
  (this->state).bit_width = 0;
  pRVar2 = ColumnDataCheckpointData::GetRowGroup(checkpoint_data);
  CreateEmptySegment(this,(pRVar2->super_SegmentBase<duckdb::RowGroup>).start);
  ::std::vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>::
  operator=(&(this->state).best_k_combinations.
             super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
            ,&(analyze_state->state).best_k_combinations.
              super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
           );
  return;
}

Assistant:

AlpCompressionState(ColumnDataCheckpointData &checkpoint_data, AlpAnalyzeState<T> *analyze_state)
	    : CompressionState(analyze_state->info), checkpoint_data(checkpoint_data),
	      function(checkpoint_data.GetCompressionFunction(CompressionType::COMPRESSION_ALP)) {
		CreateEmptySegment(checkpoint_data.GetRowGroup().start);

		//! Combinations found on the analyze step are needed for compression
		state.best_k_combinations = analyze_state->state.best_k_combinations;
	}